

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O2

bool __thiscall ManifestParser::ParseEdge(ManifestParser *this,string *err)

{
  Lexer *this_00;
  pointer *pppEVar1;
  const_iterator __last;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Rule *rule;
  Edge *this_01;
  Pool *pPVar6;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var7;
  Node *pNVar8;
  long lVar9;
  string *psVar10;
  pointer pEVar11;
  ulong uVar12;
  int iVar13;
  string pool_name;
  string dyndep;
  int local_118;
  int local_114;
  BindingEnv *local_110;
  EvalString val;
  string rule_name;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  vector<EvalString,_std::allocator<EvalString>_> validations;
  uint64_t slash_bits;
  uint64_t slash_bits_3;
  
  psVar10 = &pool_name;
  ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rule_name._M_dataplus._M_p = (pointer)0x0;
  rule_name._M_string_length = 0;
  rule_name.field_2._M_allocated_capacity = 0;
  this_00 = &(this->super_Parser).lexer_;
  bVar3 = Lexer::ReadPath(this_00,(EvalString *)&rule_name,err);
  if (bVar3) {
    do {
      if (rule_name._M_dataplus._M_p == (pointer)rule_name._M_string_length) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&rule_name);
        bVar3 = Lexer::PeekToken(this_00,PIPE);
        iVar13 = 0;
        if (!bVar3) goto LAB_00184e60;
        iVar13 = 0;
        goto LAB_00184dff;
      }
      std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                (&outs,(value_type *)&rule_name);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::clear((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               *)&rule_name);
      bVar3 = Lexer::ReadPath(this_00,(EvalString *)&rule_name,err);
    } while (bVar3);
  }
LAB_00184d7f:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&rule_name);
LAB_00184d8c:
  bVar3 = false;
LAB_00184d8e:
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&validations);
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&outs);
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&ins);
  return bVar3;
LAB_00184dff:
  rule_name._M_dataplus._M_p = (pointer)0x0;
  rule_name._M_string_length = 0;
  rule_name.field_2._M_allocated_capacity = 0;
  bVar3 = Lexer::ReadPath(this_00,(EvalString *)&rule_name,err);
  if (!bVar3) goto LAB_00184d7f;
  if (rule_name._M_dataplus._M_p != (pointer)rule_name._M_string_length) goto code_r0x00184e3b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&rule_name);
LAB_00184e60:
  if (outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_start ==
      outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rule_name,"expected path",(allocator<char> *)&pool_name);
    bVar3 = Lexer::Error(this_00,&rule_name,err);
LAB_00185137:
    std::__cxx11::string::~string((string *)&rule_name);
    goto LAB_00184d8e;
  }
  bVar3 = Parser::ExpectToken(&this->super_Parser,COLON,err);
  if (!bVar3) goto LAB_00184d8c;
  rule_name._M_dataplus._M_p = (pointer)&rule_name.field_2;
  rule_name._M_string_length = 0;
  rule_name.field_2._M_allocated_capacity =
       rule_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar3 = Lexer::ReadIdent(this_00,&rule_name);
  if (bVar3) {
    rule = BindingEnv::LookupRule(this->env_,&rule_name);
    if (rule == (Rule *)0x0) {
      std::operator+(&dyndep,"unknown build rule \'",&rule_name);
      std::operator+(&pool_name,&dyndep,"\'");
      bVar3 = Lexer::Error(this_00,&pool_name,err);
      std::__cxx11::string::~string((string *)&pool_name);
      psVar10 = &dyndep;
    }
    else {
LAB_00184ee5:
      pool_name._M_dataplus._M_p = (pointer)0x0;
      pool_name._M_string_length = 0;
      pool_name.field_2._M_allocated_capacity = 0;
      bVar3 = Lexer::ReadPath(this_00,(EvalString *)&pool_name,err);
      if (!bVar3) {
LAB_0018512d:
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&pool_name);
LAB_00185135:
        bVar3 = false;
        goto LAB_00185137;
      }
      if (pool_name._M_dataplus._M_p != (pointer)pool_name._M_string_length) {
        std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                  (&ins,(value_type *)&pool_name);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&pool_name);
        goto LAB_00184ee5;
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                 *)&pool_name);
      bVar3 = Lexer::PeekToken(this_00,PIPE);
      local_114 = 0;
      if (bVar3) {
        local_114 = 0;
        while( true ) {
          pool_name._M_dataplus._M_p = (pointer)0x0;
          pool_name._M_string_length = 0;
          pool_name.field_2._M_allocated_capacity = 0;
          bVar3 = Lexer::ReadPath(this_00,(EvalString *)&pool_name,err);
          if (!bVar3) goto LAB_0018512d;
          if (pool_name._M_dataplus._M_p == (pointer)pool_name._M_string_length) break;
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    (&ins,(value_type *)&pool_name);
          local_114 = local_114 + 1;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     *)&pool_name);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&pool_name);
      }
      bVar3 = Lexer::PeekToken(this_00,PIPE2);
      local_118 = 0;
      if (bVar3) {
        local_118 = 0;
        while( true ) {
          pool_name._M_dataplus._M_p = (pointer)0x0;
          pool_name._M_string_length = 0;
          pool_name.field_2._M_allocated_capacity = 0;
          bVar3 = Lexer::ReadPath(this_00,(EvalString *)&pool_name,err);
          if (!bVar3) goto LAB_0018512d;
          if (pool_name._M_dataplus._M_p == (pointer)pool_name._M_string_length) break;
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    (&ins,(value_type *)&pool_name);
          local_118 = local_118 + 1;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     *)&pool_name);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&pool_name);
      }
      bVar3 = Lexer::PeekToken(this_00,PIPEAT);
      if (bVar3) {
        while( true ) {
          pool_name._M_dataplus._M_p = (pointer)0x0;
          pool_name._M_string_length = 0;
          pool_name.field_2._M_allocated_capacity = 0;
          bVar3 = Lexer::ReadPath(this_00,(EvalString *)&pool_name,err);
          if (!bVar3) goto LAB_0018512d;
          if (pool_name._M_dataplus._M_p == (pointer)pool_name._M_string_length) break;
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    (&validations,(value_type *)&pool_name);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     *)&pool_name);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&pool_name);
      }
      bVar3 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
      if (!bVar3) goto LAB_00185135;
      bVar4 = Lexer::PeekToken(this_00,INDENT);
      if (bVar4) {
        local_110 = (BindingEnv *)operator_new(0x70);
        BindingEnv::BindingEnv(local_110,this->env_);
      }
      else {
        local_110 = this->env_;
      }
      while (bVar4 != false) {
        pool_name._M_dataplus._M_p = (pointer)&pool_name.field_2;
        pool_name._M_string_length = 0;
        pool_name.field_2._M_allocated_capacity =
             pool_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
        val.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        val.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        val.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar5 = ParseLet(this,&pool_name,&val,err);
        bVar4 = true;
        if (bVar5) {
          EvalString::Evaluate_abi_cxx11_(&dyndep,&val,&this->env_->super_Env);
          BindingEnv::AddBinding(local_110,&pool_name,&dyndep);
          std::__cxx11::string::~string((string *)&dyndep);
          bVar4 = Lexer::PeekToken(this_00,INDENT);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector(&val.parsed_);
        std::__cxx11::string::~string((string *)&pool_name);
        bVar3 = false;
        if (!bVar5) goto LAB_00185137;
      }
      this_01 = State::AddEdge((this->super_Parser).state_,rule);
      this_01->env_ = local_110;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dyndep,"pool",(allocator<char> *)&val);
      Edge::GetBinding(&pool_name,this_01,&dyndep);
      std::__cxx11::string::~string((string *)&dyndep);
      if (pool_name._M_string_length != 0) {
        pPVar6 = State::LookupPool((this->super_Parser).state_,&pool_name);
        if (pPVar6 != (Pool *)0x0) {
          this_01->pool_ = pPVar6;
          goto LAB_001852c2;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       "unknown pool name \'",&pool_name);
        std::operator+(&dyndep,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &val,"\'");
        bVar3 = Lexer::Error(this_00,&dyndep,err);
        std::__cxx11::string::~string((string *)&dyndep);
        psVar10 = (string *)&val;
LAB_00185824:
        std::__cxx11::string::~string((string *)psVar10);
        psVar10 = &pool_name;
        goto LAB_00184fd0;
      }
LAB_001852c2:
      std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                (&this_01->outputs_,
                 ((long)outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x18);
      bVar3 = false;
      lVar9 = 0;
      uVar12 = ((long)outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      while (uVar12 != 0) {
        EvalString::Evaluate_abi_cxx11_
                  (&dyndep,(EvalString *)
                           ((long)&((outs.
                                     super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->parsed_).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar9),
                   &local_110->super_Env);
        if (dyndep._M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&val,"empty path",(allocator<char> *)&slash_bits);
          bVar3 = Lexer::Error(this_00,(string *)&val,err);
          std::__cxx11::string::~string((string *)&val);
          bVar4 = false;
        }
        else {
          CanonicalizePath(&dyndep,&slash_bits);
          path.len_ = dyndep._M_string_length;
          path.str_ = dyndep._M_dataplus._M_p;
          bVar4 = State::AddOut((this->super_Parser).state_,this_01,path,slash_bits);
          if (bVar4) {
            bVar4 = true;
          }
          else if ((this->options_).dupe_edge_action_ == kDupeEdgeActionError) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val
                           ,"multiple rules generate ",&dyndep);
            Lexer::Error(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&val,err);
            std::__cxx11::string::~string((string *)&val);
            bVar4 = false;
            bVar3 = false;
          }
          else {
            bVar4 = true;
            if (this->quiet_ == false) {
              Warning("multiple rules generate %s. builds involving this target will not be correct; continuing anyway"
                      ,dyndep._M_dataplus._M_p);
            }
            iVar13 = iVar13 + -1 + (uint)((ulong)(long)iVar13 < uVar12);
          }
        }
        std::__cxx11::string::~string((string *)&dyndep);
        lVar9 = lVar9 + 0x18;
        uVar12 = uVar12 - 1;
        if (!bVar4) goto LAB_00184fd0;
      }
      if ((this_01->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this_01->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pppEVar1 = &(((this->super_Parser).state_)->edges_).
                    super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + -1;
        Edge::~Edge(this_01);
        operator_delete(this_01,0x88);
        bVar3 = true;
        psVar10 = &pool_name;
      }
      else {
        this_01->implicit_outs_ = iVar13;
        std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                  (&this_01->inputs_,
                   ((long)ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x18);
        pEVar11 = ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (pEVar11 ==
              ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_01->implicit_deps_ = local_114;
            this_01->order_only_deps_ = local_118;
            std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                      (&this_01->validations_,
                       ((long)validations.
                              super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            pEVar11 = validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              if (pEVar11 ==
                  validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                if (((this->options_).phony_cycle_action_ == kPhonyCycleActionWarn) &&
                   (bVar3 = Edge::maybe_phonycycle_diagnostic(this_01), bVar3)) {
                  dyndep._M_dataplus._M_p =
                       (pointer)*(this_01->outputs_).
                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  _Var7 = std::
                          __remove_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                                    ((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                      )(this_01->inputs_).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start,
                                     (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                      )(this_01->inputs_).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish,
                                     (_Iter_equals_val<Node_*const>)&dyndep);
                  __last._M_current =
                       (this_01->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if ((_Var7._M_current != __last._M_current) &&
                     (std::vector<Node_*,_std::allocator<Node_*>_>::erase
                                (&this_01->inputs_,(const_iterator)_Var7._M_current,__last),
                     this->quiet_ == false)) {
                    Warning("phony target \'%s\' names itself as an input; ignoring [-w phonycycle=warn]"
                            ,*(undefined8 *)dyndep._M_dataplus._M_p);
                  }
                }
                Edge::GetUnescapedDyndep_abi_cxx11_(&dyndep,this_01);
                bVar3 = true;
                if (dyndep._M_string_length != 0) {
                  CanonicalizePath(&dyndep,&slash_bits_3);
                  path_02.len_ = dyndep._M_string_length;
                  path_02.str_ = dyndep._M_dataplus._M_p;
                  pNVar8 = State::GetNode((this->super_Parser).state_,path_02,slash_bits_3);
                  this_01->dyndep_ = pNVar8;
                  pNVar8->dyndep_pending_ = true;
                  _Var7 = std::
                          __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                                    ((this_01->inputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start,
                                     (this_01->inputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish,&this_01->dyndep_);
                  if (_Var7._M_current ==
                      (this_01->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                      .super__Vector_impl_data._M_finish) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&slash_bits,"dyndep \'",&dyndep);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&slash_bits,"\' is not an input");
                    bVar3 = Lexer::Error(this_00,(string *)&val,err);
                    std::__cxx11::string::~string((string *)&val);
                    std::__cxx11::string::~string((string *)&slash_bits);
                  }
                }
                psVar10 = &dyndep;
                goto LAB_00185824;
              }
              EvalString::Evaluate_abi_cxx11_(&dyndep,pEVar11,&local_110->super_Env);
              sVar2 = dyndep._M_string_length;
              if (dyndep._M_string_length == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&val,"empty path",(allocator<char> *)&slash_bits);
                bVar3 = Lexer::Error(this_00,(string *)&val,err);
                std::__cxx11::string::~string((string *)&val);
              }
              else {
                CanonicalizePath(&dyndep,(uint64_t *)&val);
                path_01.len_ = dyndep._M_string_length;
                path_01.str_ = dyndep._M_dataplus._M_p;
                State::AddValidation
                          ((this->super_Parser).state_,this_01,path_01,
                           (uint64_t)
                           val.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
              }
              std::__cxx11::string::~string((string *)&dyndep);
              pEVar11 = pEVar11 + 1;
              psVar10 = &pool_name;
            } while (sVar2 != 0);
            break;
          }
          EvalString::Evaluate_abi_cxx11_(&dyndep,pEVar11,&local_110->super_Env);
          sVar2 = dyndep._M_string_length;
          if (dyndep._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&val,"empty path",(allocator<char> *)&slash_bits);
            bVar3 = Lexer::Error(this_00,(string *)&val,err);
            std::__cxx11::string::~string((string *)&val);
          }
          else {
            CanonicalizePath(&dyndep,(uint64_t *)&val);
            path_00.len_ = dyndep._M_string_length;
            path_00.str_ = dyndep._M_dataplus._M_p;
            State::AddIn((this->super_Parser).state_,this_01,path_00,
                         (uint64_t)
                         val.parsed_.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
          }
          std::__cxx11::string::~string((string *)&dyndep);
          pEVar11 = pEVar11 + 1;
          psVar10 = &pool_name;
        } while (sVar2 != 0);
      }
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pool_name,"expected build command name",(allocator<char> *)&dyndep);
    bVar3 = Lexer::Error(this_00,&pool_name,err);
    psVar10 = &pool_name;
  }
LAB_00184fd0:
  std::__cxx11::string::~string((string *)psVar10);
  goto LAB_00185137;
code_r0x00184e3b:
  std::vector<EvalString,_std::allocator<EvalString>_>::push_back(&outs,(value_type *)&rule_name);
  iVar13 = iVar13 + 1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&rule_name);
  goto LAB_00184dff;
}

Assistant:

bool ManifestParser::ParseEdge(string* err) {
  vector<EvalString> ins, outs, validations;

  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    while (!out.empty()) {
      outs.push_back(out);

      out.Clear();
      if (!lexer_.ReadPath(&out, err))
        return false;
    }
  }

  // Add all implicit outs, counting how many as we go.
  int implicit_outs = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return false;
      if (out.empty())
        break;
      outs.push_back(out);
      ++implicit_outs;
    }
  }

  if (outs.empty())
    return lexer_.Error("expected path", err);

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name))
    return lexer_.Error("expected build command name", err);

  const Rule* rule = env_->LookupRule(rule_name);
  if (!rule)
    return lexer_.Error("unknown build rule '" + rule_name + "'", err);

  for (;;) {
    // XXX should we require one path here?
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (in.empty())
      break;
    ins.push_back(in);
  }

  // Add all implicit deps, counting how many as we go.
  int implicit = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++implicit;
    }
  }

  // Add all order-only deps, counting how many as we go.
  int order_only = 0;
  if (lexer_.PeekToken(Lexer::PIPE2)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++order_only;
    }
  }

  // Add all validations, counting how many as we go.
  if (lexer_.PeekToken(Lexer::PIPEAT)) {
    for (;;) {
      EvalString validation;
      if (!lexer_.ReadPath(&validation, err))
        return false;
      if (validation.empty())
        break;
      validations.push_back(validation);
    }
  }

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  // Bindings on edges are rare, so allocate per-edge envs only when needed.
  bool has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  BindingEnv* env = has_indent_token ? new BindingEnv(env_) : env_;
  while (has_indent_token) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;

    env->AddBinding(key, val.Evaluate(env_));
    has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  }

  Edge* edge = state_->AddEdge(rule);
  edge->env_ = env;

  string pool_name = edge->GetBinding("pool");
  if (!pool_name.empty()) {
    Pool* pool = state_->LookupPool(pool_name);
    if (pool == NULL)
      return lexer_.Error("unknown pool name '" + pool_name + "'", err);
    edge->pool_ = pool;
  }

  edge->outputs_.reserve(outs.size());
  for (size_t i = 0, e = outs.size(); i != e; ++i) {
    string path = outs[i].Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    if (!state_->AddOut(edge, path, slash_bits)) {
      if (options_.dupe_edge_action_ == kDupeEdgeActionError) {
        lexer_.Error("multiple rules generate " + path, err);
        return false;
      } else {
        if (!quiet_) {
          Warning(
              "multiple rules generate %s. builds involving this target will "
              "not be correct; continuing anyway",
              path.c_str());
        }
        if (e - i <= static_cast<size_t>(implicit_outs))
          --implicit_outs;
      }
    }
  }

  if (edge->outputs_.empty()) {
    // All outputs of the edge are already created by other edges. Don't add
    // this edge.  Do this check before input nodes are connected to the edge.
    state_->edges_.pop_back();
    delete edge;
    return true;
  }
  edge->implicit_outs_ = implicit_outs;

  edge->inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    state_->AddIn(edge, path, slash_bits);
  }
  edge->implicit_deps_ = implicit;
  edge->order_only_deps_ = order_only;

  edge->validations_.reserve(validations.size());
  for (std::vector<EvalString>::iterator v = validations.begin();
      v != validations.end(); ++v) {
    string path = v->Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    state_->AddValidation(edge, path, slash_bits);
  }

  if (options_.phony_cycle_action_ == kPhonyCycleActionWarn &&
      edge->maybe_phonycycle_diagnostic()) {
    // CMake 2.8.12.x and 3.0.x incorrectly write phony build statements
    // that reference themselves.  Ninja used to tolerate these in the
    // build graph but that has since been fixed.  Filter them out to
    // support users of those old CMake versions.
    Node* out = edge->outputs_[0];
    vector<Node*>::iterator new_end =
        remove(edge->inputs_.begin(), edge->inputs_.end(), out);
    if (new_end != edge->inputs_.end()) {
      edge->inputs_.erase(new_end, edge->inputs_.end());
      if (!quiet_) {
        Warning("phony target '%s' names itself as an input; "
                "ignoring [-w phonycycle=warn]",
                out->path().c_str());
      }
    }
  }

  // Lookup, validate, and save any dyndep binding.  It will be used later
  // to load generated dependency information dynamically, but it must
  // be one of our manifest-specified inputs.
  string dyndep = edge->GetUnescapedDyndep();
  if (!dyndep.empty()) {
    uint64_t slash_bits;
    CanonicalizePath(&dyndep, &slash_bits);
    edge->dyndep_ = state_->GetNode(dyndep, slash_bits);
    edge->dyndep_->set_dyndep_pending(true);
    vector<Node*>::iterator dgi =
      std::find(edge->inputs_.begin(), edge->inputs_.end(), edge->dyndep_);
    if (dgi == edge->inputs_.end()) {
      return lexer_.Error("dyndep '" + dyndep + "' is not an input", err);
    }
  }

  return true;
}